

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O2

void btreeblk_free(btreeblk_handle *handle)

{
  btreeblk_block *pbVar1;
  list_elem *plVar2;
  list_elem *plVar3;
  list_elem *plVar4;
  long lVar5;
  ulong uVar6;
  
  plVar4 = (handle->alc_list).head;
  while (plVar4 != (list_elem *)0x0) {
    pbVar1 = (btreeblk_block *)(plVar4 + -2);
    plVar4 = list_remove(&handle->alc_list,plVar4);
    _btreeblk_free_dirty_block(handle,pbVar1);
  }
  plVar4 = (handle->read_list).head;
  while (plVar4 != (list_elem *)0x0) {
    pbVar1 = (btreeblk_block *)(plVar4 + -2);
    plVar4 = list_remove(&handle->read_list,plVar4);
    _btreeblk_free_dirty_block(handle,pbVar1);
  }
  plVar4 = (handle->blockpool).head;
  while (plVar4 != (list_elem *)0x0) {
    plVar2 = plVar4 + -1;
    plVar3 = plVar4 + -1;
    plVar4 = plVar4->next;
    free(plVar3->next);
    free(&plVar2->next);
  }
  lVar5 = 0x10;
  for (uVar6 = 0; uVar6 < handle->nsb; uVar6 = uVar6 + 1) {
    free(*(void **)((long)&handle->sb->bid + lVar5));
    lVar5 = lVar5 + 0x18;
  }
  free(handle->sb);
  return;
}

Assistant:

void btreeblk_free(struct btreeblk_handle *handle)
{
    struct list_elem *e;
    struct btreeblk_block *block;

    // free all blocks in alc list
    e = list_begin(&handle->alc_list);
    while(e) {
        block = _get_entry(e, struct btreeblk_block, le);
        e = list_remove(&handle->alc_list, &block->le);
        _btreeblk_free_dirty_block(handle, block);
    }

    // free all blocks in read list
    // linked list
    e = list_begin(&handle->read_list);
    while(e) {
        block = _get_entry(e, struct btreeblk_block, le);
        e = list_remove(&handle->read_list, &block->le);
        _btreeblk_free_dirty_block(handle, block);
    }

#ifdef __BTREEBLK_BLOCKPOOL
    // free all blocks in the block pool
    struct btreeblk_addr *item;

    e = list_begin(&handle->blockpool);
    while(e){
        item = _get_entry(e, struct btreeblk_addr, le);
        e = list_next(e);

        free_align(item->addr);
        mempool_free(item);
    }
#endif

    uint32_t i;
    for (i=0;i<handle->nsb;++i){
        free(handle->sb[i].bitmap);
    }
    free(handle->sb);
}